

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileStorageManager::SingleFileStorageManager
          (SingleFileStorageManager *this,AttachedDatabase *db,string *path,bool read_only)

{
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)path);
  StorageManager::StorageManager(&this->super_StorageManager,db,&local_40,read_only);
  ::std::__cxx11::string::~string((string *)&local_40);
  (this->super_StorageManager)._vptr_StorageManager =
       (_func_int **)&PTR__SingleFileStorageManager_027a02f8;
  (this->block_manager).
  super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
  super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = (BlockManager *)0x0;
  (this->table_io_manager).
  super_unique_ptr<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableIOManager,_std::default_delete<duckdb::TableIOManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableIOManager_*,_std::default_delete<duckdb::TableIOManager>_>.
  super__Head_base<0UL,_duckdb::TableIOManager_*,_false>._M_head_impl = (TableIOManager *)0x0;
  return;
}

Assistant:

SingleFileStorageManager::SingleFileStorageManager(AttachedDatabase &db, string path, bool read_only)
    : StorageManager(db, std::move(path), read_only) {
}